

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall cmComputeLinkInformation::AddItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  string *config;
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  size_t __n;
  bool bVar3;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  pointer pcVar7;
  const_iterator cVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  cmGeneratorTarget *tgt;
  string exe;
  LinkEntry libEntry;
  cmGeneratorTarget *local_188;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_180;
  undefined1 local_150 [64];
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  ItemIsPath local_ec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  char *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  char local_b8;
  undefined7 uStack_b7;
  undefined8 uStack_b0;
  key_type local_a8;
  string local_88;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_68;
  FeatureDescriptor *local_38;
  
  this_00 = entry->Target;
  local_188 = this_00;
  if (this_00 != (cmGeneratorTarget *)0x0) {
    config = &this->Config;
    bVar3 = cmGeneratorTarget::IsExecutableWithExports(this_00);
    if (((bVar3) && (bVar4 = cmGeneratorTarget::HasImportLibrary(this_00,config), !bVar4)) &&
       ((this->LoaderFlag).Value == (string *)0x0)) {
      return;
    }
    bVar4 = cmGeneratorTarget::IsLinkable(this_00);
    if (bVar4) {
      if (bVar3 && (this->LoaderFlag).Value != (string *)0x0) {
        bVar3 = cmGeneratorTarget::HasImportLibrary(this_00,config);
        cmGeneratorTarget::GetFullPath(&local_180.Value,this_00,config,(uint)bVar3,true);
        local_c8 = &local_b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,local_180.Value._M_dataplus._M_p,
                   local_180.Value._M_string_length + local_180.Value._M_dataplus._M_p);
        local_150._32_8_ =
             (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
             TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        local_150._40_8_ =
             (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
             TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count +
                 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count +
                 1;
          }
        }
        if (local_c8 == &local_b8) {
          local_150._24_8_ = uStack_b0;
          local_150._0_8_ = local_150 + 0x10;
        }
        else {
          local_150._0_8_ = local_c8;
        }
        local_150._17_7_ = uStack_b7;
        local_150[0x10] = local_b8;
        local_150._8_8_ = local_c0;
        local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
        local_b8 = '\0';
        local_ec = Yes;
        __n = (entry->Feature)._M_string_length;
        if (__n == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
          local_c8 = &local_b8;
          if (__n != 0) {
            pcVar7 = (entry->Feature)._M_dataplus._M_p;
            iVar6 = bcmp(pcVar7,cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p
                         ,__n);
            if (iVar6 != 0) goto LAB_00437e76;
          }
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"__CMAKE_LINK_EXECUTABLE","");
        }
        else {
          pcVar7 = (entry->Feature)._M_dataplus._M_p;
          local_c8 = &local_b8;
LAB_00437e76:
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_a8,pcVar7,pcVar7 + __n);
        }
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
                ::find(&(this->LibraryFeatureDescriptors)._M_t,&local_a8);
        local_38 = (FeatureDescriptor *)0x0;
        if ((_Rb_tree_header *)cVar8._M_node !=
            &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
          local_38 = (FeatureDescriptor *)(cVar8._M_node + 2);
        }
        std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
        emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
                  ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                    *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_150,&local_ec,&local_188,&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_);
        }
        if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
          operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->Depends,&local_180.Value);
      }
      else {
        TVar5 = cmGeneratorTarget::GetType(this_00);
        if (TVar5 != INTERFACE_LIBRARY) {
          TVar5 = cmGeneratorTarget::GetType(this_00);
          if (TVar5 == OBJECT_LIBRARY) {
            return;
          }
          bVar3 = cmGeneratorTarget::HasImportLibrary(this_00,config);
          cmGeneratorTarget::GetFullPath(&local_88,this_00,config,(uint)bVar3,true);
          local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (entry->Item).Backtrace.
                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          paVar2 = &local_180.Value.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p == &local_88.field_2) {
            local_180.Value.field_2._8_8_ = local_88.field_2._8_8_;
            local_180.Value._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_180.Value._M_dataplus._M_p = local_88._M_dataplus._M_p;
          }
          local_180.Value.field_2._M_allocated_capacity._1_7_ =
               local_88.field_2._M_allocated_capacity._1_7_;
          local_180.Value.field_2._M_local_buf[0] = local_88.field_2._M_local_buf[0];
          local_180.Value._M_string_length = local_88._M_string_length;
          local_88._M_string_length = 0;
          local_88.field_2._M_local_buf[0] = '\0';
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          bVar4 = cmTarget::IsAIX(local_188->Target);
          if (bVar4) {
            local_150._0_8_ = local_180.Value._M_string_length;
            local_150._8_8_ = local_180.Value._M_dataplus._M_p;
            if (((pointer)0x8 < local_180.Value._M_string_length) &&
               (__str_00._M_str = "-NOTFOUND", __str_00._M_len = 9,
               iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                 ((basic_string_view<char,_std::char_traits<char>_> *)local_150,
                                  (size_type)(local_180.Value._M_string_length + -9),9,__str_00),
               bVar3 && iVar6 == 0)) {
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              ~BT(&local_180);
              return;
            }
          }
          if ((this->LinkDependsNoShared != true) ||
             (TVar5 = cmGeneratorTarget::GetType(local_188), TVar5 != SHARED_LIBRARY)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->Depends,&local_180.Value);
          }
          pcVar7 = (entry->Item).Value._M_dataplus._M_p;
          local_150._0_8_ = local_150 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_150,pcVar7,pcVar7 + (entry->Item).Value._M_string_length);
          local_150._32_8_ =
               (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          local_150._40_8_ =
               (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count
                   + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_)->_M_use_count
                   + 1;
            }
          }
          local_150._56_4_ = entry->Kind;
          local_150._48_8_ = entry->Target;
          pcVar7 = (entry->Feature)._M_dataplus._M_p;
          local_110._M_p = (pointer)&local_100;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,pcVar7,pcVar7 + (entry->Feature)._M_string_length);
          std::__cxx11::string::_M_assign((string *)local_150);
          local_150._32_8_ =
               local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 0x28),
                     &local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                      .TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          AddTargetItem(this,(LinkEntry *)local_150);
          AddLibraryRuntimeInfo(this,&local_180.Value,local_188);
          if (((local_188 != (cmGeneratorTarget *)0x0) &&
              (TVar5 = cmGeneratorTarget::GetType(local_188), TVar5 == SHARED_LIBRARY)) &&
             (bVar3 = cmGeneratorTarget::IsDLLPlatform(this->Target), bVar3)) {
            AddRuntimeDLL(this,local_188);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_p != &local_100) {
            operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_);
          }
          if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
            operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
          }
          if (local_180.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_180.Backtrace.
                       super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180.Value._M_dataplus._M_p == paVar2) {
            return;
          }
          goto LAB_00437f66;
        }
        pcVar1 = local_150 + 0x10;
        local_150._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_150._16_8_ = local_150._16_8_ & 0xffffffffffffff00;
        local_180.Value._M_dataplus._M_p = local_180.Value._M_dataplus._M_p & 0xffffffff00000000;
        local_150._0_8_ = pcVar1;
        std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
        emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&>
                  ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                    *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_150,(ItemIsPath *)&local_180,&local_188);
        if ((char *)local_150._0_8_ != pcVar1) {
          operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
        }
        cmGeneratorTarget::GetImportedLibName(&local_180.Value,local_188,config);
        if ((pointer)local_180.Value._M_string_length != (pointer)0x0) {
          local_e8 = &local_d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,local_180.Value._M_dataplus._M_p,
                     local_180.Value._M_string_length + local_180.Value._M_dataplus._M_p);
          local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (entry->Item).Backtrace.
                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          paVar2 = &local_68.Value.field_2;
          if (local_e8 == &local_d8) {
            local_68.Value.field_2._8_8_ = local_d8._8_8_;
            local_68.Value._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_68.Value._M_dataplus._M_p = (pointer)local_e8;
          }
          local_68.Value.field_2._M_allocated_capacity._1_7_ = local_d8._M_allocated_capacity._1_7_;
          local_68.Value.field_2._M_local_buf[0] = local_d8._M_local_buf[0];
          local_68.Value._M_string_length = local_e0;
          local_e0 = 0;
          local_d8._M_local_buf[0] = '\0';
          local_e8 = &local_d8;
          cmComputeLinkDepends::LinkEntry::LinkEntry
                    ((LinkEntry *)local_150,&local_68,(cmGeneratorTarget *)0x0);
          AddItem(this,(LinkEntry *)local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_p != &local_100) {
            operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._40_8_);
          }
          if ((char *)local_150._0_8_ != pcVar1) {
            operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
          }
          if (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_68.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                       .TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68.Value._M_dataplus._M_p != paVar2) {
            operator_delete(local_68.Value._M_dataplus._M_p,
                            local_68.Value.field_2._M_allocated_capacity + 1);
          }
          if (local_e8 != &local_d8) {
            operator_delete(local_e8,CONCAT71(local_d8._M_allocated_capacity._1_7_,
                                              local_d8._M_local_buf[0]) + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.Value._M_dataplus._M_p == &local_180.Value.field_2) {
        return;
      }
LAB_00437f66:
      operator_delete(local_180.Value._M_dataplus._M_p,
                      local_180.Value.field_2._M_allocated_capacity + 1);
      return;
    }
  }
  local_150._8_8_ = (entry->Feature)._M_dataplus._M_p;
  pcVar7 = (pointer)(entry->Feature)._M_string_length;
  local_150._0_8_ = pcVar7;
  if (pcVar7 < (pointer)0x9) {
LAB_00437b81:
    if (((pcVar7 == (pointer)cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length)
        && ((pcVar7 == (pointer)0x0 ||
            (iVar6 = bcmp((entry->Feature)._M_dataplus._M_p,
                          cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,
                          (size_t)pcVar7), iVar6 == 0)))) &&
       (bVar3 = cmSystemTools::IsPathToFramework((string *)entry), bVar3)) {
      this_01 = this->Makefile;
      local_150._0_8_ = local_150 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"APPLE","");
      bVar3 = cmMakefile::IsOn(this_01,(string *)local_150);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      if (bVar3) goto LAB_00437c0a;
    }
    bVar3 = cmsys::SystemTools::FileIsFullPath((string *)entry);
    if (bVar3) {
      bVar3 = cmsys::SystemTools::FileIsDirectory((string *)entry);
      if (bVar3) {
        DropDirectoryItem(this,&entry->Item);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Depends,(value_type *)entry);
        AddFullItem(this,entry);
        AddLibraryRuntimeInfo(this,(string *)entry);
      }
    }
    else {
      AddUserItem(this,entry,true);
    }
  }
  else {
    __str._M_str = "FRAMEWORK";
    __str._M_len = 9;
    iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_150,
                       (size_type)(pcVar7 + -9),9,__str);
    if (iVar6 != 0) {
      pcVar7 = (pointer)(entry->Feature)._M_string_length;
      goto LAB_00437b81;
    }
LAB_00437c0a:
    AddFrameworkItem(this,entry);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(LinkEntry const& entry)
{
  cmGeneratorTarget const* tgt = entry.Target;
  BT<std::string> const& item = entry.Item;

  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if (impexe && !tgt->HasImportLibrary(config) && !this->LoaderFlag) {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
  }

  if (tgt && tgt->IsLinkable()) {
    // This is a CMake target.  Ask the target for its real name.
    if (impexe && this->LoaderFlag) {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now using a special feature.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      std::string exe = tgt->GetFullPath(config, artifact, true);
      this->Items.emplace_back(
        BT<std::string>(exe, item.Backtrace), ItemIsPath::Yes, tgt,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_EXECUTABLE"
                                   : entry.Feature));
      this->Depends.push_back(std::move(exe));
    } else if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.emplace_back(std::string(), ItemIsPath::No, tgt);

      // Also add the item the interface specifies to be used in its place.
      std::string const& libName = tgt->GetImportedLibName(config);
      if (!libName.empty()) {
        this->AddItem(BT<std::string>(libName, item.Backtrace));
      }
    } else if (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      // Ignore object library!
      // Its object-files should already have been extracted for linking.
    } else {
      // Decide whether to use an import library.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      // Pass the full path to the target file.
      BT<std::string> lib = BT<std::string>(
        tgt->GetFullPath(config, artifact, true), item.Backtrace);
      if (tgt->Target->IsAIX() && cmHasLiteralSuffix(lib.Value, "-NOTFOUND") &&
          artifact == cmStateEnums::ImportLibraryArtifact) {
        // This is an imported executable on AIX that has ENABLE_EXPORTS
        // but not IMPORTED_IMPLIB.  CMake used to produce and accept such
        // imported executables on AIX before we taught it to use linker
        // import files.  For compatibility, simply skip linking to this
        // executable as we did before.  It works with runtime linking.
        return;
      }
      if (!this->LinkDependsNoShared ||
          tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
        this->Depends.push_back(lib.Value);
      }

      LinkEntry libEntry{ entry };
      libEntry.Item = lib;
      this->AddTargetItem(libEntry);
      this->AddLibraryRuntimeInfo(lib.Value, tgt);
      if (tgt && tgt->GetType() == cmStateEnums::SHARED_LIBRARY &&
          this->Target->IsDLLPlatform()) {
        this->AddRuntimeDLL(tgt);
      }
    }
  } else {
    // This is not a CMake target.  Use the name given.
    if (cmHasSuffix(entry.Feature, "FRAMEWORK"_s) ||
        (entry.Feature == DEFAULT &&
         cmSystemTools::IsPathToFramework(item.Value) &&
         this->Makefile->IsOn("APPLE"))) {
      // This is a framework.
      this->AddFrameworkItem(entry);
    } else if (cmSystemTools::FileIsFullPath(item.Value)) {
      if (cmSystemTools::FileIsDirectory(item.Value)) {
        // This is a directory.
        this->DropDirectoryItem(item);
      } else {
        // Use the full path given to the library file.
        this->Depends.push_back(item.Value);
        this->AddFullItem(entry);
        this->AddLibraryRuntimeInfo(item.Value);
      }
    } else {
      // This is a library or option specified by the user.
      this->AddUserItem(entry, true);
    }
  }
}